

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,true,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  uhugeint_t shift;
  uhugeint_t shift_00;
  uhugeint_t shift_01;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint64_t in_stack_ffffffffffffff58;
  uhugeint_t local_98;
  uhugeint_t local_88;
  ulong local_78;
  uhugeint_t *local_70;
  uint64_t local_68;
  uint64_t uStack_60;
  uhugeint_t local_58;
  ulong local_40;
  ValidityMask *local_38;
  
  local_78 = count;
  local_70 = ldata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = ldata->lower;
      uStack_60 = ldata->upper;
      lVar5 = 8;
      do {
        local_98.lower = *(uint64_t *)((long)rdata + lVar5 + -8);
        local_98.upper = *(uint64_t *)((long)&rdata->lower + lVar5);
        local_58.lower = local_68;
        local_58.upper = uStack_60;
        shift_01.upper = in_stack_ffffffffffffff58;
        shift_01.lower = 0x722d2b;
        bVar2 = RightShiftInRange<duckdb::uhugeint_t>(shift_01);
        if (bVar2) {
          auVar12 = duckdb::uhugeint_t::operator>>(&local_58,&local_98);
        }
        else {
          duckdb::uhugeint_t::uhugeint_t(&local_88,0);
          auVar12._8_8_ = local_88.upper;
          auVar12._0_8_ = local_88.lower;
        }
        *(long *)((long)result_data + lVar5 + -8) = auVar12._0_8_;
        *(long *)((long)&result_data->lower + lVar5) = auVar12._8_8_;
        lVar5 = lVar5 + 0x10;
        local_78 = local_78 - 1;
      } while (local_78 != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_40 = count + 0x3f >> 6;
    uVar3 = 0;
    uVar8 = 0;
    local_38 = mask;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = uVar8 + 0x40;
        if (local_78 <= uVar8 + 0x40) {
          uVar6 = local_78;
        }
LAB_00722bae:
        uVar7 = uVar8;
        if (uVar8 < uVar6) {
          local_68 = local_70->lower;
          uStack_60 = local_70->upper;
          uVar4 = uVar8 << 4 | 8;
          do {
            local_98.lower = *(uint64_t *)((long)rdata + (uVar4 - 8));
            local_98.upper = *(uint64_t *)((long)&rdata->lower + uVar4);
            local_58.lower = local_68;
            local_58.upper = uStack_60;
            shift.upper = in_stack_ffffffffffffff58;
            shift.lower = 0x722bed;
            bVar2 = RightShiftInRange<duckdb::uhugeint_t>(shift);
            if (bVar2) {
              auVar10 = duckdb::uhugeint_t::operator>>(&local_58,&local_98);
            }
            else {
              duckdb::uhugeint_t::uhugeint_t(&local_88,0);
              auVar10._8_8_ = local_88.upper;
              auVar10._0_8_ = local_88.lower;
            }
            *(long *)((long)result_data + (uVar4 - 8)) = auVar10._0_8_;
            *(long *)((long)&result_data->lower + uVar4) = auVar10._8_8_;
            uVar8 = uVar8 + 1;
            uVar4 = uVar4 + 0x10;
            uVar7 = uVar6;
          } while (uVar6 != uVar8);
        }
      }
      else {
        uVar4 = puVar1[uVar3];
        uVar6 = uVar8 + 0x40;
        if (local_78 <= uVar8 + 0x40) {
          uVar6 = local_78;
        }
        uVar7 = uVar6;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_00722bae;
          local_68 = uVar6 - uVar8;
          uVar7 = uVar8;
          if (uVar8 <= uVar6 && local_68 != 0) {
            uVar9 = uVar8 << 4 | 8;
            uVar8 = 0;
            do {
              if ((uVar4 >> (uVar8 & 0x3f) & 1) != 0) {
                local_98.lower = *(uint64_t *)((long)rdata + (uVar9 - 8));
                local_98.upper = *(uint64_t *)((long)&rdata->lower + uVar9);
                local_58.lower = local_70->lower;
                local_58.upper = local_70->upper;
                shift_00.upper = in_stack_ffffffffffffff58;
                shift_00.lower = 0x722c7c;
                bVar2 = RightShiftInRange<duckdb::uhugeint_t>(shift_00);
                if (bVar2) {
                  auVar11 = duckdb::uhugeint_t::operator>>(&local_58,&local_98);
                }
                else {
                  duckdb::uhugeint_t::uhugeint_t(&local_88,0);
                  auVar11._8_8_ = local_88.upper;
                  auVar11._0_8_ = local_88.lower;
                }
                *(long *)((long)result_data + (uVar9 - 8)) = auVar11._0_8_;
                *(long *)((long)&result_data->lower + uVar9) = auVar11._8_8_;
              }
              uVar8 = uVar8 + 1;
              uVar9 = uVar9 + 0x10;
              mask = local_38;
              uVar7 = uVar6;
            } while (local_68 != uVar8);
          }
        }
      }
      uVar3 = uVar3 + 1;
      uVar8 = uVar7;
    } while (uVar3 != local_40);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}